

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::make_port3_test::test(make_port3_test *this)

{
  int in_R8D;
  int iVar1;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  compile_fixture::build_libs(&this->super_compile_fixture);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(port? standard-input-port)",&local_7e9);
  compile_fixture::run(&local_28,&this->super_compile_fixture,&local_7e8,true,in_R8D);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf58,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(input-port? standard-input-port)",&local_7e9);
  compile_fixture::run(&local_48,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf59,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(output-port? standard-input-port)",&local_7e9);
  compile_fixture::run(&local_68,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(port? standard-output-port)",&local_7e9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(input-port? standard-output-port)",&local_7e9);
  compile_fixture::run(&local_a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(output-port? standard-output-port)",&local_7e9);
  compile_fixture::run(&local_c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(port? standard-error-port)",&local_7e9);
  compile_fixture::run(&local_e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(input-port? standard-error-port)",&local_7e9);
  compile_fixture::run(&local_108,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf5f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(output-port? standard-error-port)",&local_7e9);
  compile_fixture::run(&local_128,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf60,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,
             "(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"
             ,&local_7e9);
  compile_fixture::run(&local_148,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf62,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(current-output-port)",&local_7e9);
  compile_fixture::run(&local_168,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdout\"",&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf64,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(current-output-port alternative-output-port)",&local_7e9);
  compile_fixture::run(&local_188,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf65,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(current-output-port)",&local_7e9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"altout\"",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf66,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(current-input-port)",&local_7e9);
  compile_fixture::run(&local_1c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stdin\"",&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf67,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(current-error-port)",&local_7e9);
  compile_fixture::run(&local_1e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"stderr\"",&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf68,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,
             "(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"
             ,&local_7e9);
  compile_fixture::run(&local_208,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(flush-output-port)",&local_7e9);
  compile_fixture::run(&local_228,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(open-file \"out.txt\" #f)",&local_7e9);
  compile_fixture::run(&local_248,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-file 3)",&local_7e9);
  compile_fixture::run(&local_268,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf6e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(define my_file (open-output-file \"out.txt\"))",&local_7e9);
  compile_fixture::run(&local_288,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf70,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(%slot-ref my_file 2)",&local_7e9);
  compile_fixture::run(&local_2a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf71,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\o my_file)",&local_7e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf72,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\u my_file)",&local_7e9);
  compile_fixture::run(&local_2e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_2e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf73,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\t my_file)",&local_7e9);
  compile_fixture::run(&local_308,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf74,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\p my_file)",&local_7e9);
  compile_fixture::run(&local_328,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf75,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\u my_file)",&local_7e9);
  compile_fixture::run(&local_348,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_348,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf76,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(write-char #\\t my_file)",&local_7e9);
  compile_fixture::run(&local_368,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("",&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf77,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-output-port my_file)",&local_7e9);
  compile_fixture::run(&local_388,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_388,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf78,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-output-port my_file)",&local_7e9);
  compile_fixture::run(&local_3a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf79,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(define my_file (open-input-file \"out.txt\"))",&local_7e9);
  compile_fixture::run(&local_3c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_3c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(input-port? my_file)",&local_7e9);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_408,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_428,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_428,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_448,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf7f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_468,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_468,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf80,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_488,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf81,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_4a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf82,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_4c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_4c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf83,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_4e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_4e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf84,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-input-port my_file)",&local_7e9);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf85,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-input-port my_file)",&local_7e9);
  compile_fixture::run(&local_528,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_528,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf86,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,
             "(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"
             ,&local_7e9);
  compile_fixture::run(&local_548,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"out.txt\"",&local_548,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf88,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(%slot-ref my_file 5)",&local_7e9);
  compile_fixture::run(&local_568,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_568,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf89,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(input-port? my_file)",&local_7e9);
  compile_fixture::run(&local_588,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_5a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\o",&local_5a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_5c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_5c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_5e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_5e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8d,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_608,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_608,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8e,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf8f,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_648,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_648,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf90,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_668,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_668,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf91,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_688,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\p",&local_688,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf92,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_6a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_6a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf93,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_6c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\u",&local_6c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf94,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_6e8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_6e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf95,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_708,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#\\t",&local_708,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf96,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(peek-char my_file)",&local_7e9);
  compile_fixture::run(&local_728,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_728,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf97,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf98,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(read-char my_file)",&local_7e9);
  compile_fixture::run(&local_768,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#eof",&local_768,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf99,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(eof-object? (read-char my_file))",&local_7e9);
  compile_fixture::run(&local_788,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_788,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9a,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(close-input-port my_file)",&local_7e9);
  compile_fixture::run(&local_7a8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  iVar1 = 0x1c3374;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_7a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9b,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"(eof-object? 3)",&local_7e9);
  compile_fixture::run(&local_7c8,&this->super_compile_fixture,&local_7e8,true,iVar1);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_7c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf9c,"void skiwi::(anonymous namespace)::make_port3_test::test()");
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  return;
}

Assistant:

void test()
      {
      build_libs();
      TEST_EQ("#t", run("(port? standard-input-port)"));
      TEST_EQ("#t", run("(input-port? standard-input-port)"));
      TEST_EQ("#f", run("(output-port? standard-input-port)"));
      TEST_EQ("#t", run("(port? standard-output-port)"));
      TEST_EQ("#f", run("(input-port? standard-output-port)"));
      TEST_EQ("#t", run("(output-port? standard-output-port)"));
      TEST_EQ("#t", run("(port? standard-error-port)"));
      TEST_EQ("#f", run("(input-port? standard-error-port)"));
      TEST_EQ("#t", run("(output-port? standard-error-port)"));

      TEST_EQ("<port>: \"altout\"", run("(define alternative-output-port (make-port #f \"altout\" 1 (make-string 1024) 0 1024))"));

      TEST_EQ("<port>: \"stdout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port alternative-output-port)"));
      TEST_EQ("<port>: \"altout\"", run("(current-output-port)"));
      TEST_EQ("<port>: \"stdin\"", run("(current-input-port)"));
      TEST_EQ("<port>: \"stderr\"", run("(current-error-port)"));

      TEST_EQ("", run("(write-char #\\f)(write-char #\\l)(write-char #\\u)(write-char #\\s)(write-char #\\h)(write-char #\\010)"));
      TEST_EQ("", run("(flush-output-port)"));

      TEST_EQ("3", run("(open-file \"out.txt\" #f)"));
      TEST_EQ("0", run("(close-file 3)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-output-file \"out.txt\"))"));
      TEST_EQ("3", run("(%slot-ref my_file 2)")); // gets file handle id
      TEST_EQ("", run("(write-char #\\o my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("", run("(write-char #\\p my_file)"));
      TEST_EQ("", run("(write-char #\\u my_file)"));
      TEST_EQ("", run("(write-char #\\t my_file)"));
      TEST_EQ("0", run("(close-output-port my_file)"));
      TEST_EQ("-1", run("(close-output-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(define my_file (open-input-file \"out.txt\"))"));
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("-1", run("(close-input-port my_file)"));

      TEST_EQ("<port>: \"out.txt\"", run("(set! my_file (let ([fh (open-file \"out.txt\" #t)])(make-port #t \"out.txt\" fh (make-string 3) 3 3)))"));
      TEST_EQ("3", run("(%slot-ref my_file 5)")); // size of buffer
      TEST_EQ("#t", run("(input-port? my_file)"));
      TEST_EQ("#\\o", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#\\p", run("(peek-char my_file)"));
      TEST_EQ("#\\p", run("(read-char my_file)"));
      TEST_EQ("#\\u", run("(peek-char my_file)"));
      TEST_EQ("#\\u", run("(read-char my_file)"));
      TEST_EQ("#\\t", run("(peek-char my_file)"));
      TEST_EQ("#\\t", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(peek-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#eof", run("(read-char my_file)"));
      TEST_EQ("#t", run("(eof-object? (read-char my_file))"));
      TEST_EQ("0", run("(close-input-port my_file)"));
      TEST_EQ("#f", run("(eof-object? 3)"));
      }